

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

bool __thiscall ADehackedPickup::TryPickup(ADehackedPickup *this,AActor **toucher)

{
  ActorFlags *pAVar1;
  bool bVar2;
  PClassActor *type;
  AInventory *this_00;
  DVector3 local_30;
  
  type = DetermineType(this);
  if (type != (PClassActor *)0x0) {
    local_30.X = (this->super_AInventory).super_AActor.__Pos.X;
    local_30.Y = (this->super_AInventory).super_AActor.__Pos.Y;
    local_30.Z = (this->super_AInventory).super_AActor.__Pos.Z;
    this_00 = (AInventory *)AActor::StaticSpawn(type,&local_30,NO_REPLACE,false);
    this->RealPickup = this_00;
    if (this_00 == (AInventory *)0x0) {
      return false;
    }
    AActor::ClearCounters((AActor *)this_00);
    if (((this->super_AInventory).super_AActor.flags.Value & 0x20000) == 0) {
      pAVar1 = &(this->RealPickup->super_AActor).flags;
      pAVar1->Value = pAVar1->Value & 0xfffdffff;
    }
    if (this->droppedbymonster == true) {
      ModifyDropAmount(this->RealPickup,0);
    }
    bVar2 = AInventory::CallTryPickup(this->RealPickup,*toucher,(AActor **)0x0);
    if (bVar2) {
      AInventory::GoAwayAndDie(&this->super_AInventory);
      return true;
    }
    (*(this->RealPickup->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
    this->RealPickup = (AInventory *)0x0;
  }
  return false;
}

Assistant:

bool ADehackedPickup::TryPickup (AActor *&toucher)
{
	PClassActor *type = DetermineType ();
	if (type == NULL)
	{
		return false;
	}
	RealPickup = static_cast<AInventory *>(Spawn (type, Pos(), NO_REPLACE));
	if (RealPickup != NULL)
	{
		// The internally spawned item should never count towards statistics.
		RealPickup->ClearCounters();
		if (!(flags & MF_DROPPED))
		{
			RealPickup->flags &= ~MF_DROPPED;
		}
		// If this item has been dropped by a monster the
		// amount of ammo this gives must be adjusted.
		if (droppedbymonster)
		{
			ModifyDropAmount(RealPickup, 0);
		}
		if (!RealPickup->CallTryPickup (toucher))
		{
			RealPickup->Destroy ();
			RealPickup = NULL;
			return false;
		}
		GoAwayAndDie ();
		return true;
	}
	return false;
}